

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  stbrp_node *psVar5;
  stbrp_node *psVar6;
  stbrp_context *psVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  stbrp_node **ppsVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  stbrp_node *psVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  stbrp_context *in_R8;
  ulong uVar19;
  stbrp_context *psVar20;
  stbrp_node **ppsVar21;
  stbrp_context *c;
  stbrp_rect *psVar22;
  uint local_98;
  int local_94;
  stbrp_node **local_80;
  uint local_78;
  int local_50;
  int waste;
  stbrp_node **local_48;
  size_t local_40;
  stbrp_rect *local_38;
  
  uVar10 = 0;
  uVar19 = 0;
  if (0 < num_rects) {
    uVar19 = (ulong)(uint)num_rects;
  }
  piVar14 = &rects->was_packed;
  for (; uVar19 != uVar10; uVar10 = uVar10 + 1) {
    *piVar14 = (int)uVar10;
    piVar14 = piVar14 + 4;
  }
  local_40 = (size_t)num_rects;
  qsort(rects,local_40,0x10,rect_height_compare);
  local_48 = &context->active_head;
  uVar10 = 0;
  local_38 = rects;
  do {
    if (uVar10 == uVar19) {
      qsort(rects,local_40,0x10,rect_original_order);
      for (lVar12 = 0; uVar19 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        uVar17 = 1;
        if (*(short *)((long)&rects->x + lVar12) == -1) {
          uVar17 = (uint)(*(short *)((long)&rects->y + lVar12) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar12) = uVar17;
      }
      return (int)lVar12;
    }
    uVar1 = rects[uVar10].w;
    if ((uVar1 == 0) || (uVar2 = rects[uVar10].h, uVar2 == 0)) {
      rects[uVar10].x = 0;
      rects[uVar10].y = 0;
    }
    else {
      iVar16 = context->width;
      iVar18 = (uint)uVar1 + context->align + -1;
      iVar18 = iVar18 - iVar18 % context->align;
      psVar22 = rects;
      if (iVar18 <= iVar16) {
        iVar4 = context->height;
        local_78 = (uint)uVar2;
        if ((int)local_78 <= iVar4) {
          c = (stbrp_context *)*local_48;
          local_94 = 0x40000000;
          uVar17 = 0x40000000;
          local_80 = (stbrp_node **)0x0;
          psVar20 = c;
          ppsVar21 = local_48;
          while( true ) {
            uVar3 = (ushort)psVar20->width;
            uVar13 = (uint)uVar2;
            if (iVar16 < (int)((uint)uVar3 + iVar18)) break;
            uVar8 = stbrp__skyline_find_min_y
                              (psVar20,(stbrp_node *)(ulong)uVar3,iVar18,(int)&waste,&in_R8->width);
            if (context->heuristic == 0) {
              if ((int)uVar8 < (int)uVar17) {
                uVar17 = uVar8;
                local_80 = ppsVar21;
              }
            }
            else if (((int)(uVar13 + uVar8) <= iVar4) &&
                    (((int)uVar8 < (int)uVar17 || (waste < local_94 && uVar8 == uVar17)))) {
              local_94 = waste;
              uVar17 = uVar8;
              local_80 = ppsVar21;
            }
            ppsVar21 = (stbrp_node **)&psVar20->align;
            psVar20 = *(stbrp_context **)&psVar20->align;
          }
          if (local_80 == (stbrp_node **)0x0) {
            local_98 = 0;
          }
          else {
            local_98 = (uint)(*local_80)->x;
          }
          psVar20 = c;
          if (context->heuristic == 1) {
            while (ppsVar21 = local_48, (int)(uint)(ushort)psVar20->width < iVar18) {
              psVar20 = *(stbrp_context **)&psVar20->align;
            }
            for (; psVar20 != (stbrp_context *)0x0; psVar20 = *(stbrp_context **)&psVar20->align) {
              uVar8 = (uint)(ushort)psVar20->width - iVar18;
              psVar7 = c;
              do {
                c = psVar7;
                ppsVar11 = ppsVar21;
                ppsVar21 = (stbrp_node **)&c->align;
                psVar7 = *(stbrp_context **)&c->align;
              } while ((int)(uint)(ushort)(*(stbrp_context **)&c->align)->width <= (int)uVar8);
              uVar9 = stbrp__skyline_find_min_y
                                (c,(stbrp_node *)(ulong)uVar8,iVar18,(int)&local_50,&in_R8->width);
              if ((((int)(uVar13 + uVar9) <= iVar4) && ((int)uVar9 <= (int)uVar17)) &&
                 (((uVar9 < uVar17 || (local_50 < local_94)) ||
                  ((local_50 == local_94 && ((int)uVar8 < (int)local_98)))))) {
                local_94 = local_50;
                uVar17 = uVar9;
                local_98 = uVar8;
                local_80 = ppsVar11;
              }
              ppsVar21 = ppsVar11;
            }
          }
          psVar22 = local_38;
          if (((local_80 != (stbrp_node **)0x0) && ((int)(uVar13 + uVar17) <= iVar4)) &&
             (psVar5 = context->free_head, psVar5 != (stbrp_node *)0x0)) {
            psVar5->x = (stbrp_coord)local_98;
            psVar5->y = (stbrp_coord)(uVar13 + uVar17);
            context->free_head = psVar5->next;
            psVar6 = *local_80;
            psVar15 = psVar6;
            if ((int)(uint)psVar6->x < (int)local_98) {
              psVar15 = psVar6->next;
              local_80 = &psVar6->next;
            }
            *local_80 = psVar5;
            iVar16 = local_98 + uVar1;
            in_R8 = (stbrp_context *)(ulong)local_98;
            while ((psVar6 = psVar15->next, psVar6 != (stbrp_node *)0x0 &&
                   ((int)(uint)psVar6->x <= iVar16))) {
              psVar15->next = context->free_head;
              context->free_head = psVar15;
              psVar15 = psVar6;
              in_R8 = context;
            }
            psVar5->next = psVar15;
            if ((int)(uint)psVar15->x < iVar16) {
              psVar15->x = (stbrp_coord)iVar16;
            }
            rects[uVar10].x = (stbrp_coord)local_98;
            rects[uVar10].y = (stbrp_coord)uVar17;
            rects = local_38;
            goto LAB_00135c56;
          }
        }
      }
      rects[uVar10].x = 0xffff;
      rects[uVar10].y = 0xffff;
      rects = psVar22;
    }
LAB_00135c56:
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}